

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void Commands::SpawnItem(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  int local_60;
  undefined1 local_50 [8];
  PacketBuilder reply;
  int amount;
  int id;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  reply.add_size._4_4_ = util::to_int(pvVar2);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(arguments);
  if (sVar3 < 2) {
    local_60 = 1;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](arguments,1);
    local_60 = util::to_int(pvVar2);
  }
  reply.add_size._0_4_ = local_60;
  bVar1 = Character::AddItem(from,(short)reply.add_size._4_4_,local_60);
  if (bVar1) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_ITEM,PACKET_GET,9);
    PacketBuilder::AddShort((PacketBuilder *)local_50,0);
    PacketBuilder::AddShort((PacketBuilder *)local_50,reply.add_size._4_4_);
    PacketBuilder::AddThree((PacketBuilder *)local_50,(int)reply.add_size);
    PacketBuilder::AddChar((PacketBuilder *)local_50,from->weight);
    PacketBuilder::AddChar((PacketBuilder *)local_50,from->maxweight);
    Character::Send(from,(PacketBuilder *)local_50);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  }
  return;
}

Assistant:

void SpawnItem(const std::vector<std::string>& arguments, Character* from)
{
	int id = util::to_int(arguments[0]);
	int amount = (arguments.size() >= 2) ? util::to_int(arguments[1]) : 1;

	if (from->AddItem(id, amount))
	{
		PacketBuilder reply(PACKET_ITEM, PACKET_GET, 9);
		reply.AddShort(0); // UID
		reply.AddShort(id);
		reply.AddThree(amount);
		reply.AddChar(from->weight);
		reply.AddChar(from->maxweight);
		from->Send(reply);
	}
}